

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

uint __thiscall Clock::GetTimeDelta(Clock *this)

{
  uint uVar1;
  uint local_18;
  uint delta;
  uint ticks;
  Clock *this_local;
  
  uVar1 = clock_ticks();
  local_18 = uVar1 - this->last;
  if ((int)local_18 < 0) {
    Console::Wrn("A time delta of %i ms was detected and ignored.",(ulong)local_18);
    local_18 = 0;
  }
  if (this->max_delta < (int)local_18) {
    Console::Wrn("A time delta of %i ms was detected and ignored.",(ulong)local_18);
    local_18 = this->max_delta;
  }
  this->last = uVar1;
  return local_18;
}

Assistant:

unsigned int Clock::GetTimeDelta()
{
	unsigned int ticks = clock_ticks();
	unsigned int delta = ticks - last;

	if ((int)delta < 0)
	{
		Console::Wrn("A time delta of %i ms was detected and ignored.", delta);
		delta = 0;
	}

	if ((int)delta > max_delta)
	{
		Console::Wrn("A time delta of %i ms was detected and ignored.", delta);
		delta = max_delta;
	}

	last = ticks;

	return delta;
}